

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.cpp
# Opt level: O2

idx_t __thiscall duckdb::Executor::GetPipelinesProgress(Executor *this,ProgressData *progress)

{
  pointer psVar1;
  bool bVar2;
  Pipeline *this_00;
  shared_ptr<duckdb::Pipeline,_true> *pipeline;
  pointer this_01;
  idx_t iVar3;
  ProgressData p;
  ProgressData local_48;
  
  ::std::mutex::lock(&this->executor_lock);
  progress->done = 0.0;
  progress->total = 0.0;
  psVar1 = (this->pipelines).
           super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           .
           super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  iVar3 = 0;
  for (this_01 = (this->pipelines).
                 super_vector<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 .
                 super__Vector_base<duckdb::shared_ptr<duckdb::Pipeline,_true>,_std::allocator<duckdb::shared_ptr<duckdb::Pipeline,_true>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; this_01 != psVar1; this_01 = this_01 + 1
      ) {
    local_48.done = 0.0;
    local_48.total = 0.0;
    local_48.invalid = false;
    this_00 = shared_ptr<duckdb::Pipeline,_true>::operator->(this_01);
    bVar2 = Pipeline::GetProgress(this_00,&local_48);
    if (bVar2) {
      ProgressData::Add(progress,&local_48);
    }
    else {
      iVar3 = iVar3 + 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->executor_lock);
  return iVar3;
}

Assistant:

idx_t Executor::GetPipelinesProgress(ProgressData &progress) { // LCOV_EXCL_START
	lock_guard<mutex> elock(executor_lock);

	progress.done = 0;
	progress.total = 0;
	idx_t count_invalid = 0;
	for (auto &pipeline : pipelines) {
		ProgressData p;
		if (!pipeline->GetProgress(p)) {
			count_invalid++;
		} else {
			progress.Add(p);
		}
	}
	return count_invalid;
}